

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O2

void __thiscall
draco::Encoder::SetAttributeQuantization(Encoder *this,Type type,int quantization_bits)

{
  allocator<char> local_45;
  Type local_44;
  string local_40;
  
  local_44 = type;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"quantization_bits",&local_45);
  DracoOptions<draco::GeometryAttribute::Type>::SetAttributeInt
            (&(this->super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>).
              options_.super_DracoOptions<draco::GeometryAttribute::Type>,&local_44,&local_40,
             quantization_bits);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Encoder::SetAttributeQuantization(GeometryAttribute::Type type,
                                       int quantization_bits) {
  options().SetAttributeInt(type, "quantization_bits", quantization_bits);
}